

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

wchar_t textui_get_quantity(char *prompt,wchar_t max)

{
  _Bool _Var1;
  wchar_t wVar2;
  ushort **ppuVar3;
  char buf [80];
  char tmp [80];
  
  if (max == L'\x01') {
    wVar2 = L'\x01';
  }
  else {
    if (prompt == (char *)0x0) {
      prompt = tmp;
      strnfmt(prompt,0x50,"Quantity (0-%d, *=all): ",max);
    }
    strnfmt(buf,0x50,"%d",1);
    _Var1 = get_string(prompt,buf,7);
    if (!_Var1) {
      return L'\0';
    }
    if ((ulong)(byte)buf[0] != 0x2a) {
      wVar2 = atoi(buf);
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (ulong)(byte)buf[0] * 2 + 1) & 4) == 0) goto LAB_001c532f;
    }
    wVar2 = max;
  }
LAB_001c532f:
  if (wVar2 < max) {
    max = wVar2;
  }
  wVar2 = L'\0';
  if (L'\0' < max) {
    wVar2 = max;
  }
  return wVar2;
}

Assistant:

static int textui_get_quantity(const char *prompt, int max)
{
	int amt = 1;

	/* Prompt if needed */
	if (max != 1) {
		char tmp[80];
		char buf[80];

		/* Build a prompt if needed */
		if (!prompt) {
			/* Build a prompt */
			strnfmt(tmp, sizeof(tmp), "Quantity (0-%d, *=all): ", max);

			/* Use that prompt */
			prompt = tmp;
		}

		/* Build the default */
		strnfmt(buf, sizeof(buf), "%d", amt);

		/* Ask for a quantity */
		if (!get_string(prompt, buf, 7)) return (0);

		/* Extract a number */
		amt = atoi(buf);

		/* A star or letter means "all" */
		if ((buf[0] == '*') || isalpha((unsigned char)buf[0])) amt = max;
	}

	/* Enforce the maximum */
	if (amt > max) amt = max;

	/* Enforce the minimum */
	if (amt < 0) amt = 0;

	/* Return the result */
	return (amt);
}